

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void drop_near(chunk *c,object **dropped,wchar_t chance,loc grid,_Bool verbose,_Bool prefer_pile)

{
  object **ppoVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  uint32_t y;
  loc_conflict lVar5;
  loc grid_00;
  object *poVar6;
  loc_conflict lVar7;
  square *psVar8;
  byte bVar9;
  loc lVar10;
  int x;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  _Bool dont_ignore;
  int local_e0;
  int local_dc;
  loc local_d8;
  player *local_d0;
  undefined4 local_c8;
  int local_c4;
  ulong local_c0;
  object **local_b8;
  chunk *local_b0;
  loc local_a8;
  loc_conflict local_a0;
  ulong local_98;
  object *local_90;
  char o_name [80];
  
  local_c8 = CONCAT31(in_register_00000089,prefer_pile);
  if ((int)CONCAT71(in_register_00000081,verbose) == 0) {
    dont_ignore = false;
  }
  else {
    _Var2 = ignore_item_ok(player,*dropped);
    dont_ignore = !_Var2;
  }
  local_d8 = grid;
  if ((chunk *)cave != c) {
    __assert_fail("c == cave",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                  ,0x470,
                  "void drop_near(struct chunk *, struct object **, int, struct loc, _Bool, _Bool)")
    ;
  }
  object_desc(o_name,0x50,*dropped,0,player);
  lVar10 = local_d8;
  poVar6 = *dropped;
  local_b8 = dropped;
  if (poVar6->artifact == (artifact *)0x0) {
    wVar3 = Rand_div(100);
    poVar6 = *local_b8;
    if (wVar3 < chance) {
      _Var2 = true;
      goto LAB_001a0dfd;
    }
  }
  local_c0 = (ulong)lVar10 >> 0x20;
  local_d0 = player;
  local_dc = -1;
  lVar5 = (loc_conflict)((ulong)lVar10 & 0xffffffff);
  uVar13 = local_c0;
  local_b0 = c;
  local_90 = poVar6;
  for (iVar14 = -3; iVar14 != 4; iVar14 = iVar14 + 1) {
    local_c4 = iVar14 * iVar14;
    local_a0 = lVar5;
    local_98 = uVar13;
    for (x = -3; x != 4; x = x + 1) {
      uVar12 = x * x + local_c4;
      lVar5 = loc(x,iVar14);
      grid_00 = (loc)loc_sum((loc_conflict)lVar10,lVar5);
      if ((((uVar12 < 0xb) && (_Var2 = square_in_bounds_fully((chunk_conflict *)c,grid_00), _Var2))
          && (_Var2 = los((chunk_conflict *)c,(loc_conflict)lVar10,(loc_conflict)grid_00), _Var2))
         && ((_Var2 = square_isfloor((chunk_conflict *)c,grid_00), _Var2 &&
             (_Var2 = square_istrap((chunk_conflict *)c,grid_00), !_Var2)))) {
        local_e0 = iVar14;
        local_a8 = grid_00;
        poVar6 = square_object((chunk_conflict *)c,grid_00);
        bVar9 = 0;
        iVar14 = 0;
        iVar11 = 0;
        for (; c = local_b0, poVar6 != (object *)0x0; poVar6 = poVar6->next) {
          _Var2 = object_mergeable(poVar6,local_90,OSTACK_FLOOR);
          if (_Var2) {
            bVar9 = 1;
          }
          _Var2 = ignore_item_ok(local_d0,poVar6);
          iVar14 = iVar14 + (uint)!_Var2;
          iVar11 = iVar11 + (uint)_Var2;
        }
        uVar15 = iVar14 + (uint)(~bVar9 & 1);
        if ((((local_d0->opts).opt[0x22] != false) ||
            (lVar10 = local_d8, iVar14 = local_e0, uVar15 < 2)) &&
           ((iVar11 + uVar15 <= (uint)z_info->floor_size ||
            (poVar6 = floor_get_oldest_ignored(local_d0,local_b0,local_a8), lVar10 = local_d8,
            iVar14 = local_e0, poVar6 != (object *)0x0)))) {
          lVar10 = local_d8;
          iVar14 = local_e0;
          iVar11 = uVar15 * -5;
          if ((char)local_c8 != '\0') {
            iVar11 = 0;
          }
          iVar11 = (iVar11 - uVar12) + 1000;
          if ((local_dc <= iVar11) && ((iVar11 != local_dc || (uVar4 = Rand_div(2), uVar4 != 0)))) {
            local_98 = (ulong)local_a8 >> 0x20;
            local_a0 = (loc_conflict)((ulong)local_a8 & 0xffffffff);
            local_dc = iVar11;
          }
        }
      }
    }
    lVar5 = local_a0;
    uVar13 = local_98;
  }
  if (local_dc < 0) {
    if (local_90->artifact == (artifact *)0x0) {
LAB_001a0d94:
      uVar13 = local_c0 & 0xffffffff;
      lVar5 = (loc_conflict)((ulong)lVar10 & 0xffffffff);
    }
    else {
      uVar12 = 0;
      do {
        if (uVar12 == 2000) goto LAB_001a0d94;
        if (uVar12 < 1000) {
          lVar7 = rand_loc((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar13 << 0x20),1,1);
          lVar5 = (loc_conflict)((ulong)lVar7 & 0xffffffff);
          if (c->width <= lVar7.x) {
            lVar5.y = 0;
            lVar5.x = c->width + L'\xffffffff';
          }
          if (lVar5.x < 1) {
            lVar5.x = 0;
            lVar5.y = 0;
          }
          uVar13 = (ulong)lVar7 >> 0x20;
          if (c->height <= lVar7.y) {
            uVar13 = (ulong)(uint)(c->height + L'\xffffffff');
          }
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
        }
        else {
          uVar4 = Rand_div(c->width);
          y = Rand_div(c->height);
          lVar5 = loc(uVar4,y);
          uVar13 = (ulong)lVar5 >> 0x20;
        }
        _Var2 = square_canputitem((chunk_conflict *)c,
                                  (loc)((ulong)lVar5 & 0xffffffff | uVar13 << 0x20));
        uVar12 = uVar12 + 1;
      } while (!_Var2);
    }
  }
  ppoVar1 = local_b8;
  lVar10 = (loc)((ulong)lVar5 & 0xffffffff | uVar13 << 0x20);
  _Var2 = floor_carry(c,lVar10,*local_b8,&dont_ignore);
  if (_Var2) {
    sound(5);
    if (dont_ignore != true) {
      return;
    }
    psVar8 = square((chunk_conflict *)c,lVar10);
    if (-1 < psVar8->mon) {
      return;
    }
    msg("You feel something roll beneath your feet.");
    return;
  }
  poVar6 = *ppoVar1;
  _Var2 = false;
LAB_001a0dfd:
  floor_carry_fail(c,poVar6,_Var2);
  return;
}

Assistant:

void drop_near(struct chunk *c, struct object **dropped, int chance,
			   struct loc grid, bool verbose, bool prefer_pile)
{
	char o_name[80];
	struct loc best = grid;
	bool dont_ignore = verbose && !ignore_item_ok(player, *dropped);

	/* Only called in the current level */
	assert(c == cave);

	/* Describe object */
	object_desc(o_name, sizeof(o_name), *dropped, ODESC_BASE, player);

	/* Handle normal breakage */
	if (!((*dropped)->artifact) && (randint0(100) < chance)) {
		floor_carry_fail(c, *dropped, true);
		return;
	}

	/* Find the best grid and drop the item, destroying if there's no space */
	drop_find_grid(player, c, *dropped, prefer_pile, &best);
	if (floor_carry(c, best, *dropped, &dont_ignore)) {
		sound(MSG_DROP);
		if (dont_ignore && (square(c, best)->mon < 0)) {
			msg("You feel something roll beneath your feet.");
		}
	} else {
		floor_carry_fail(c, *dropped, false);
	}
}